

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq4x_16.cpp
# Opt level: O2

int Diff(uint32_t c1,uint32_t c2)

{
  int iVar1;
  
  iVar1 = yuv_diff(RGBtoYUV32[c1 & 0xffffff],RGBtoYUV32[c2 & 0xffffff]);
  return iVar1;
}

Assistant:

bool Diff(const unsigned int rgb1, const unsigned int rgb2)
{
  if (rgb1 == rgb2)
  {
    return false;
  }
	
  static const hq_vec THRESHOLD = 0x00300706;
  
  const hq_vec yuv1 = RGBtoYUV[rgb1];
  const hq_vec yuv2 = RGBtoYUV[rgb2];

  const hq_vec delta1 = yuv1 - yuv2;
  const hq_vec delta2 = yuv2 - yuv1;

  const hq_vec delta  = delta1 | delta2;
  const hq_vec result = delta - THRESHOLD;

  return 0 != result;
}